

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

int32_t __thiscall icu_63::IslamicCalendar::trueMonthStart(IslamicCalendar *this,int32_t month)

{
  int32_t iVar1;
  int32_t iVar2;
  double dVar3;
  UErrorCode status;
  UErrorCode local_24;
  double local_20;
  
  local_24 = U_ZERO_ERROR;
  iVar1 = CalendarCache::get(&gMonthCache,month,&local_24);
  if (iVar1 == 0) {
    dVar3 = uprv_floor_63((double)month * 29.530588853);
    local_20 = dVar3 * 86400000.0 + -42521587200000.0;
    dVar3 = moonAge(local_20,&local_24);
    iVar1 = 0;
    if (local_24 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0.0 <= dVar3) {
        do {
          local_20 = local_20 + -86400000.0;
          dVar3 = moonAge(local_20,&local_24);
          iVar1 = 0;
          if (U_ZERO_ERROR < local_24) goto LAB_001f124c;
        } while (0.0 <= dVar3);
      }
      else {
        do {
          local_20 = local_20 + 86400000.0;
          dVar3 = moonAge(local_20,&local_24);
          if (U_ZERO_ERROR < local_24) goto LAB_001f124c;
        } while (dVar3 < 0.0);
      }
      dVar3 = uprv_floor_63((local_20 + 42521587200000.0) / 86400000.0);
      CalendarCache::put(&gMonthCache,month,(int)dVar3 + 1,&local_24);
      iVar1 = (int)dVar3 + 1;
    }
  }
LAB_001f124c:
  iVar2 = 0;
  if (local_24 < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int32_t IslamicCalendar::trueMonthStart(int32_t month) const
{
    UErrorCode status = U_ZERO_ERROR;
    int32_t start = CalendarCache::get(&gMonthCache, month, status);

    if (start==0) {
        // Make a guess at when the month started, using the average length
        UDate origin = HIJRA_MILLIS 
            + uprv_floor(month * CalendarAstronomer::SYNODIC_MONTH) * kOneDay;

        // moonAge will fail due to memory allocation error
        double age = moonAge(origin, status);
        if (U_FAILURE(status)) {
            goto trueMonthStartEnd;
        }

        if (age >= 0) {
            // The month has already started
            do {
                origin -= kOneDay;
                age = moonAge(origin, status);
                if (U_FAILURE(status)) {
                    goto trueMonthStartEnd;
                }
            } while (age >= 0);
        }
        else {
            // Preceding month has not ended yet.
            do {
                origin += kOneDay;
                age = moonAge(origin, status);
                if (U_FAILURE(status)) {
                    goto trueMonthStartEnd;
                }
            } while (age < 0);
        }
        start = (int32_t)ClockMath::floorDivide((origin - HIJRA_MILLIS), (double)kOneDay) + 1;
        CalendarCache::put(&gMonthCache, month, start, status);
    }
trueMonthStartEnd :
    if(U_FAILURE(status)) {
        start = 0;
    }
    return start;
}